

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O0

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  Mat *in_RDI;
  float fVar2;
  Mat *in_stack_00000008;
  Mat *in_stack_00000010;
  int in_stack_0000001c;
  undefined4 in_stack_ffffffffffffff90;
  int def;
  
  def = 0x10;
  iVar1 = ParamDict::get(in_RSI,0,0x10);
  *(int *)&in_RDI[2].elemsize = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,def);
  *(int *)((long)&in_RDI[2].elemsize + 4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,6000);
  *(int *)&in_RDI[2].allocator = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,300);
  *(int *)((long)&in_RDI[2].allocator + 4) = iVar1;
  fVar2 = ParamDict::get(in_RSI,4,0.7);
  in_RDI[2].dims = (int)fVar2;
  iVar1 = ParamDict::get(in_RSI,5,def);
  in_RDI[2].w = iVar1;
  generate_anchors(in_stack_0000001c,in_stack_00000010,in_stack_00000008);
  Mat::operator=(in_RDI,(Mat *)CONCAT44(def,in_stack_ffffffffffffff90));
  Mat::~Mat((Mat *)0x122d46);
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

//     Mat ratio;
//     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}